

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestFailure.cpp
# Opt level: O0

void __thiscall
CheckFailure::CheckFailure
          (CheckFailure *this,UtestShell *test,char *fileName,size_t lineNumber,
          SimpleString *checkString,SimpleString *conditionString,SimpleString *text)

{
  size_t in_RDX;
  SimpleString *in_RSI;
  TestFailure *in_RDI;
  SimpleString *in_R9;
  TestFailure *unaff_retaddr;
  SimpleString *in_stack_ffffffffffffffb0;
  char *in_stack_ffffffffffffffc8;
  TestFailure *this_00;
  
  this_00 = in_RDI;
  TestFailure::TestFailure(unaff_retaddr,(UtestShell *)in_RDI,(char *)in_RSI,in_RDX);
  in_RDI->_vptr_TestFailure = (_func_int **)&PTR__CheckFailure_00139938;
  TestFailure::createUserText(this_00,in_RSI);
  SimpleString::operator=(in_stack_ffffffffffffffb0,(SimpleString *)in_RDI);
  SimpleString::~SimpleString((SimpleString *)0x119cd1);
  SimpleString::operator+=(in_stack_ffffffffffffffb0,(SimpleString *)in_RDI);
  SimpleString::operator+=(in_R9,in_stack_ffffffffffffffc8);
  SimpleString::operator+=(in_stack_ffffffffffffffb0,(SimpleString *)in_RDI);
  SimpleString::operator+=(in_R9,in_stack_ffffffffffffffc8);
  return;
}

Assistant:

CheckFailure::CheckFailure(UtestShell* test, const char* fileName, size_t lineNumber, const SimpleString& checkString, const SimpleString& conditionString, const SimpleString& text)
: TestFailure(test, fileName, lineNumber)
{
    message_ = createUserText(text);

    message_ += checkString;
    message_ += "(";
    message_ += conditionString;
    message_ += ") failed";
}